

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mockaron.cpp
# Opt level: O1

void mockaron::detail::register_function_mock(void *n,any *h)

{
  size_type sVar1;
  mapped_type *pmVar2;
  void *local_10;
  
  local_10 = n;
  sVar1 = std::
          _Hashtable<const_void_*,_std::pair<const_void_*const,_mockaron::detail::any>,_std::allocator<std::pair<const_void_*const,_mockaron::detail::any>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count((_Hashtable<const_void_*,_std::pair<const_void_*const,_mockaron::detail::any>,_std::allocator<std::pair<const_void_*const,_mockaron::detail::any>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(anonymous_namespace)::function_mocks,&local_10);
  if (sVar1 == 0) {
    pmVar2 = std::__detail::
             _Map_base<const_void_*,_std::pair<const_void_*const,_mockaron::detail::any>,_std::allocator<std::pair<const_void_*const,_mockaron::detail::any>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_void_*,_std::pair<const_void_*const,_mockaron::detail::any>,_std::allocator<std::pair<const_void_*const,_mockaron::detail::any>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)(anonymous_namespace)::function_mocks,&local_10);
    pmVar2->_ptr = h->_ptr;
    std::function<void_(void_*)>::operator=(&pmVar2->_deleter,&h->_deleter);
    h->_ptr = (void *)0x0;
    return;
  }
  __assert_fail("!function_mocks.count(n)",
                "/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/src/mockaron.cpp"
                ,0x33,"void mockaron::detail::register_function_mock(const void *, any)");
}

Assistant:

void register_function_mock(void const* n, any h)
{
  assert(!function_mocks.count(n));
  function_mocks[n] = std::move(h);
}